

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

DdNode ** Cudd_bddConstrainDecomp(DdManager *dd,DdNode *f)

{
  int iVar1;
  ulong uVar2;
  int local_30;
  int i;
  int res;
  DdNode **decomp;
  DdNode *f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)malloc((long)dd->size << 3);
  if (dd_local == (DdManager *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (local_30 = 0; local_30 < dd->size; local_30 = local_30 + 1) {
      *(undefined8 *)(&(dd_local->sentinel).index + (long)local_30 * 2) = 0;
    }
    do {
      dd->reordered = 0;
      for (local_30 = 0; local_30 < dd->size; local_30 = local_30 + 1) {
        if (*(long *)(&(dd_local->sentinel).index + (long)local_30 * 2) != 0) {
          Cudd_IterDerefBdd(dd,*(DdNode **)(&(dd_local->sentinel).index + (long)local_30 * 2));
          *(undefined8 *)(&(dd_local->sentinel).index + (long)local_30 * 2) = 0;
        }
      }
      iVar1 = cuddBddConstrainDecomp(dd,f,(DdNode **)dd_local);
    } while (dd->reordered == 1);
    if (iVar1 == 0) {
      if (dd_local != (DdManager *)0x0) {
        free(dd_local);
      }
      dd_local = (DdManager *)0x0;
    }
    else {
      for (local_30 = 0; local_30 < dd->size; local_30 = local_30 + 1) {
        if (*(long *)(&(dd_local->sentinel).index + (long)local_30 * 2) == 0) {
          *(DdNode **)(&(dd_local->sentinel).index + (long)local_30 * 2) = dd->one;
          uVar2 = *(ulong *)(&(dd_local->sentinel).index + (long)local_30 * 2) & 0xfffffffffffffffe;
          *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
        }
      }
    }
  }
  return (DdNode **)dd_local;
}

Assistant:

DdNode **
Cudd_bddConstrainDecomp(
  DdManager * dd,
  DdNode * f)
{
    DdNode **decomp;
    int res;
    int i;

    /* Create an initialize decomposition array. */
    decomp = ABC_ALLOC(DdNode *,dd->size);
    if (decomp == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < dd->size; i++) {
        decomp[i] = NULL;
    }
    do {
        dd->reordered = 0;
        /* Clean up the decomposition array in case reordering took place. */
        for (i = 0; i < dd->size; i++) {
            if (decomp[i] != NULL) {
                Cudd_IterDerefBdd(dd, decomp[i]);
                decomp[i] = NULL;
            }
        }
        res = cuddBddConstrainDecomp(dd,f,decomp);
    } while (dd->reordered == 1);
    if (res == 0) {
        ABC_FREE(decomp);
        return(NULL);
    }
    /* Missing components are constant ones. */
    for (i = 0; i < dd->size; i++) {
        if (decomp[i] == NULL) {
            decomp[i] = DD_ONE(dd);
            cuddRef(decomp[i]);
        }
    }
    return(decomp);

}